

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
RemoveLast(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  undefined8 *puVar1;
  int iVar2;
  LogMessage *other;
  LogFinisher LStack_49;
  LogMessage LStack_48;
  
  iVar2 = (this->super_RepeatedPtrFieldBase).current_size_;
  if (iVar2 < 1) {
    internal::LogMessage::LogMessage
              (&LStack_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x397);
    other = internal::LogMessage::operator<<(&LStack_48,"CHECK failed: (current_size_) > (0): ");
    internal::LogFinisher::operator=(&LStack_49,other);
    internal::LogMessage::~LogMessage(&LStack_48);
    iVar2 = (this->super_RepeatedPtrFieldBase).current_size_;
  }
  (this->super_RepeatedPtrFieldBase).current_size_ = iVar2 + -1;
  puVar1 = (undefined8 *)((this->super_RepeatedPtrFieldBase).rep_)->elements[(long)iVar2 + -1];
  puVar1[1] = 0;
  *(undefined1 *)*puVar1 = 0;
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::RemoveLast() {
  RepeatedPtrFieldBase::RemoveLast<TypeHandler>();
}